

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

int Gia_FormStrCount(char *pStr,int *pnVars,int *pnPars)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  byte *pbVar4;
  byte bVar5;
  char *pcVar6;
  int iVar7;
  int *piVar8;
  
  if (*pStr == '(') {
    sVar3 = strlen(pStr);
    if (pStr[sVar3 - 1] == ')') {
      iVar2 = 0;
      pcVar6 = pStr;
      do {
        cVar1 = *pcVar6;
        if (cVar1 == '(') {
          iVar2 = iVar2 + 1;
        }
        else if (cVar1 == ')') {
          iVar2 = iVar2 + -1;
        }
        else if (cVar1 == '\0') goto LAB_0053393a;
        pcVar6 = pcVar6 + 1;
      } while( true );
    }
    pcVar6 = "The last symbol should be the closing parenthesis \")\".";
  }
  else {
    pcVar6 = "The first symbol should be the opening parenthesis \"(\".";
  }
  goto LAB_00533945;
LAB_0053393a:
  if (iVar2 == 0) {
    *pnVars = 0;
    *pnPars = 0;
    bVar5 = *pStr;
    if (bVar5 != 0) {
      pbVar4 = (byte *)(pStr + 1);
      do {
        iVar2 = -0x60;
        piVar8 = pnVars;
        if (((byte)(bVar5 + 0x9f) < 2) || (iVar2 = -0x6f, piVar8 = pnPars, (bVar5 & 0xfc) == 0x70))
        {
          iVar7 = iVar2 + (uint)bVar5;
          if ((int)(iVar2 + (uint)bVar5) < *piVar8) {
            iVar7 = *piVar8;
          }
          *piVar8 = iVar7;
        }
        else if (((0x38 < bVar5 - 0x26) ||
                 ((0x10000000210000dU >> ((ulong)(bVar5 - 0x26) & 0x3f) & 1) == 0)) &&
                (bVar5 != 0x7c)) {
          if (bVar5 != 0x7e) {
            printf("Unknown symbol (%c) in the formula (%s)\n",(ulong)(uint)(int)(char)bVar5,pStr);
            return 1;
          }
          if ((byte)(*pbVar4 + 0x85) < 0xe6) {
            pcVar6 = "Expecting alphabetic symbol (instead of \"%c\") after negation (~)\n";
            goto LAB_00533a03;
          }
        }
        bVar5 = *pbVar4;
        pbVar4 = pbVar4 + 1;
      } while (bVar5 != 0);
    }
    if (*pnVars == 2) {
      return 0;
    }
    pcVar6 = "The number of input variables (%d) should be 2\n";
LAB_00533a03:
    printf(pcVar6);
    return 1;
  }
  pcVar6 = "The number of opening and closing parentheses is not equal.";
LAB_00533945:
  puts(pcVar6);
  return 1;
}

Assistant:

int Gia_FormStrCount( char * pStr, int * pnVars, int * pnPars )
{
    int i, Counter = 0;
    if ( pStr[0] != '(' )
    {
        printf( "The first symbol should be the opening parenthesis \"(\".\n" );
        return 1;
    }
    if ( pStr[strlen(pStr)-1] != ')' )
    {
        printf( "The last symbol should be the closing parenthesis \")\".\n" );
        return 1;
    }
    for ( i = 0; pStr[i]; i++ )
        if (  pStr[i] == '(' )
            Counter++;
        else if (  pStr[i] == ')' )
            Counter--;
    if ( Counter != 0 )
    {
        printf( "The number of opening and closing parentheses is not equal.\n" );
        return 1;
    }
    *pnVars = 0;
    *pnPars = 0;
    for ( i = 0; pStr[i]; i++ )
    {
        if ( pStr[i] >= 'a' && pStr[i] <= 'b' )
            *pnVars = Abc_MaxInt( *pnVars, pStr[i] - 'a' + 1 );
        else if ( pStr[i] >= 'p' && pStr[i] <= 's' )
            *pnPars = Abc_MaxInt( *pnPars, pStr[i] - 'p' + 1 );
        else if ( pStr[i] == '(' || pStr[i] == ')' )
        {}
        else if ( pStr[i] == '&' || pStr[i] == '|' || pStr[i] == '^' )
        {}
        else if ( pStr[i] == '?' || pStr[i] == ':' )
        {}
        else if ( pStr[i] == '~' )
        {
            if ( pStr[i+1] < 'a' || pStr[i+1] > 'z' )
            {
                printf( "Expecting alphabetic symbol (instead of \"%c\") after negation (~)\n",  pStr[i+1] );
                return 1;
            }
        }
        else 
        {
            printf( "Unknown symbol (%c) in the formula (%s)\n", pStr[i], pStr );
            return 1;
        }
    }
    if ( *pnVars != FFTEST_MAX_VARS )
        { printf( "The number of input variables (%d) should be 2\n", *pnVars ); return 1; }
    if ( *pnPars < 1 && *pnPars > FFTEST_MAX_PARS )
        { printf( "The number of parameters should be between 1 and %d\n", *pnPars ); return 1; }
    return 0;
}